

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectPololux(POLOLU *pPololu)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((POLOLU *)addrsPololu[lVar2] == pPololu) {
      iVar1 = DisconnectPololu(pPololu);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsPololu[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectPololux(POLOLU* pPololu)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectPololu(pPololu);
	if (res != EXIT_SUCCESS) return res;

	addrsPololu[id] = NULL;

	return EXIT_SUCCESS;
}